

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O2

void printTypedVectorList
               (MCInst *MI,uint OpNum,SStream *O,uint NumLanes,char LaneKind,MCRegisterInfo *MRI)

{
  uint8_t *puVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  _Bool _Var3;
  uint uVar4;
  uint Reg;
  uint uVar5;
  cs_ac_type cVar6;
  arm64_reg aVar7;
  MCOperand *op;
  MCRegisterClass *pMVar8;
  undefined3 in_register_00000081;
  int iVar9;
  int local_68;
  undefined4 local_64;
  char Suffix [32];
  int iVar10;
  
  iVar10 = 2;
  if (NumLanes == 0) {
    local_68 = 0;
    cs_snprintf(Suffix,0x20,".%c",(ulong)CONCAT31(in_register_00000081,LaneKind));
    if (LaneKind == 's') {
      local_64 = 3;
    }
    else if (LaneKind == 'd') {
      local_64 = 4;
    }
    else if (LaneKind == 'h') {
      local_64 = 2;
    }
    else if (LaneKind == 'b') {
      local_64 = 1;
    }
    else {
      local_64 = 0;
    }
  }
  else {
    local_64 = 0;
    cs_snprintf(Suffix,0x20,".%u%c");
    if (LaneKind == 's') {
      if (NumLanes == 4) {
        local_68 = 6;
      }
      else {
        if (NumLanes != 2) goto LAB_002023e3;
        local_68 = 5;
      }
    }
    else if (LaneKind == 'd') {
      if (NumLanes == 2) {
        local_68 = 8;
      }
      else {
        if (NumLanes != 1) goto LAB_002023e3;
        local_68 = 7;
      }
    }
    else if (LaneKind == 'h') {
      if (NumLanes == 8) {
        local_68 = 4;
      }
      else {
        if (NumLanes != 4) goto LAB_002023e3;
        local_68 = 3;
      }
    }
    else if (LaneKind == 'q') {
      local_68 = (uint)(NumLanes == 1) * 9;
    }
    else if (LaneKind == 'b') {
      if (NumLanes == 0x10) {
        local_68 = 2;
      }
      else {
        if (NumLanes != 8) goto LAB_002023e3;
        local_68 = 1;
      }
    }
    else {
LAB_002023e3:
      local_68 = 0;
    }
  }
  op = MCInst_getOperand(MI,OpNum);
  uVar4 = MCOperand_getReg(op);
  SStream_concat0(O,"{");
  pMVar8 = MCRegisterInfo_getRegClass(MRI,0x10);
  _Var3 = MCRegisterClass_contains(pMVar8,uVar4);
  if (!_Var3) {
    pMVar8 = MCRegisterInfo_getRegClass(MRI,0x15);
    _Var3 = MCRegisterClass_contains(pMVar8,uVar4);
    if (!_Var3) {
      pMVar8 = MCRegisterInfo_getRegClass(MRI,0x13);
      _Var3 = MCRegisterClass_contains(pMVar8,uVar4);
      iVar10 = 3;
      if (!_Var3) {
        pMVar8 = MCRegisterInfo_getRegClass(MRI,0x19);
        _Var3 = MCRegisterClass_contains(pMVar8,uVar4);
        if (!_Var3) {
          pMVar8 = MCRegisterInfo_getRegClass(MRI,0x14);
          _Var3 = MCRegisterClass_contains(pMVar8,uVar4);
          if (!_Var3) {
            pMVar8 = MCRegisterInfo_getRegClass(MRI,0x20);
            _Var3 = MCRegisterClass_contains(pMVar8,uVar4);
            if (!_Var3) {
              iVar10 = 1;
              goto LAB_002024eb;
            }
          }
          iVar10 = 4;
        }
      }
    }
  }
LAB_002024eb:
  Reg = MCRegisterInfo_getSubReg(MRI,uVar4,3);
  if ((Reg == 0) && (uVar5 = MCRegisterInfo_getSubReg(MRI,uVar4,10), Reg = uVar4, uVar5 != 0)) {
    Reg = uVar5;
  }
  pMVar8 = MCRegisterInfo_getRegClass(MRI,10);
  _Var3 = MCRegisterClass_contains(pMVar8,Reg);
  if (_Var3) {
    pMVar8 = MCRegisterInfo_getRegClass(MRI,0x11);
    Reg = MCRegisterInfo_getMatchingSuperReg(MRI,Reg,2,pMVar8);
  }
  while (iVar9 = iVar10 + -1, iVar10 != 0) {
    SStream_concat(O,"%s%s",getRegisterName_AsmStrsvreg +
                            *(ushort *)(getRegisterName_RegAsmOffsetvreg + (ulong)(Reg - 1) * 2),
                   Suffix);
    if (iVar10 != 1) {
      SStream_concat0(O,", ");
    }
    h = MI->csh;
    if (h->detail != CS_OPT_OFF) {
      uVar4 = MCInst_getOpcode(MI);
      cVar6 = get_op_access(h,uVar4,(uint)MI->ac_idx);
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar6;
      MI->ac_idx = MI->ac_idx + '\x01';
      pcVar2 = MI->flat_insn->detail;
      puVar1 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      aVar7 = AArch64_map_vregister(Reg);
      pcVar2 = MI->flat_insn->detail;
      *(arm64_reg *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x35) = aVar7;
      pcVar2 = MI->flat_insn->detail;
      *(int *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x19) = local_68;
      pcVar2 = MI->flat_insn->detail;
      *(undefined4 *)(pcVar2->groups + (ulong)(pcVar2->field_6).x86.opcode[2] * 0x38 + 0x1d) =
           local_64;
      puVar1 = (MI->flat_insn->detail->field_6).x86.opcode + 2;
      *puVar1 = *puVar1 + '\x01';
    }
    uVar4 = Reg - 0x69;
    Reg = 0x69;
    iVar10 = iVar9;
    if (uVar4 < 0x1f) {
      Reg = *(uint *)(&DAT_0036f3f8 + (ulong)uVar4 * 4);
    }
  }
  SStream_concat0(O,"}");
  return;
}

Assistant:

static void printTypedVectorList(MCInst *MI, unsigned OpNum, SStream *O, unsigned NumLanes, char LaneKind, MCRegisterInfo *MRI)
{
	char Suffix[32];
	arm64_vas vas = 0;
	arm64_vess vess = 0;

	if (NumLanes) {
		cs_snprintf(Suffix, sizeof(Suffix), ".%u%c", NumLanes, LaneKind);
		switch(LaneKind) {
			default: break;
			case 'b':
				switch(NumLanes) {
					default: break;
					case 8:
							 vas = ARM64_VAS_8B;
							 break;
					case 16:
							 vas = ARM64_VAS_16B;
							 break;
				}
				break;
			case 'h':
				switch(NumLanes) {
					default: break;
					case 4:
							 vas = ARM64_VAS_4H;
							 break;
					case 8:
							 vas = ARM64_VAS_8H;
							 break;
				}
				break;
			case 's':
				switch(NumLanes) {
					default: break;
					case 2:
							 vas = ARM64_VAS_2S;
							 break;
					case 4:
							 vas = ARM64_VAS_4S;
							 break;
				}
				break;
			case 'd':
				switch(NumLanes) {
					default: break;
					case 1:
							 vas = ARM64_VAS_1D;
							 break;
					case 2:
							 vas = ARM64_VAS_2D;
							 break;
				}
				break;
			case 'q':
				switch(NumLanes) {
					default: break;
					case 1:
							 vas = ARM64_VAS_1Q;
							 break;
				}
				break;
		}
	} else {
		cs_snprintf(Suffix, sizeof(Suffix), ".%c", LaneKind);
		switch(LaneKind) {
			default: break;
			case 'b':
					 vess = ARM64_VESS_B;
					 break;
			case 'h':
					 vess = ARM64_VESS_H;
					 break;
			case 's':
					 vess = ARM64_VESS_S;
					 break;
			case 'd':
					 vess = ARM64_VESS_D;
					 break;
		}
	}

	printVectorList(MI, OpNum, O, Suffix, MRI, vas, vess);
}